

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::IfcTendon(IfcTendon *this)

{
  *(undefined ***)&this->field_0x220 = &PTR__Object_008d12a0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(char **)&this->field_0x230 = "IfcTendon";
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__0096bde0);
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x198 = 0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x96bc60;
  *(undefined8 *)&this->field_0x220 = 0x96bdc8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x96bc88;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x96bcb0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x96bcd8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x96bd00;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x96bd28;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x96bd50;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x96bd78;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x96bda0;
  *(undefined1 **)&(this->super_IfcReinforcingElement).field_0x1a0 = &this->field_0x1b0;
  *(undefined8 *)&this->field_0x1a8 = 0;
  this->field_0x1b0 = 0;
  (this->TensionForce).have = false;
  (this->PreStress).have = false;
  (this->FrictionCoefficient).have = false;
  (this->AnchorageSlip).have = false;
  (this->MinCurvatureRadius).have = false;
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}